

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.cpp
# Opt level: O0

int luaH_getn(Table *t)

{
  uint uVar1;
  uint uVar2;
  uint local_20;
  uint m;
  uint i;
  uint j;
  Table *t_local;
  
  t_local._4_4_ = t->sizearray;
  if ((t_local._4_4_ == 0) || (t->array[t_local._4_4_ - 1].tt_ != 0)) {
    if (t->node != &dummynode_) {
      t_local._4_4_ = unbound_search(t,t_local._4_4_);
    }
  }
  else {
    local_20 = 0;
    uVar1 = local_20;
    m = t_local._4_4_;
    while (local_20 = uVar1, 1 < m - local_20) {
      uVar2 = local_20 + m >> 1;
      uVar1 = uVar2;
      if (t->array[uVar2 - 1].tt_ == 0) {
        uVar1 = local_20;
        m = uVar2;
      }
    }
    t_local._4_4_ = local_20;
  }
  return t_local._4_4_;
}

Assistant:

int luaH_getn (Table *t) {
  unsigned int j = t->sizearray;
  if (j > 0 && ttisnil(&t->array[j - 1])) {
    /* there is a boundary in the array part: (binary) search for it */
    unsigned int i = 0;
    while (j - i > 1) {
      unsigned int m = (i+j)/2;
      if (ttisnil(&t->array[m - 1])) j = m;
      else i = m;
    }
    return i;
  }
  /* else must find a boundary in hash part */
  else if (isdummy(t->node))  /* hash part is empty? */
    return j;  /* that is easy... */
  else return unbound_search(t, j);
}